

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O0

bool __thiscall
anon_unknown.dwarf_12932::GeneratorDpllTriadSimd::Constrain
          (GeneratorDpllTriadSimd *this,bool pencilmark,char *puzzle)

{
  undefined1 uVar1;
  bool bVar2;
  uint *puVar3;
  size_t sVar4;
  long in_RDX;
  byte in_SIL;
  Util *in_RDI;
  char prior_unconstrained_value;
  int cell_or_literal;
  State test_state;
  Cells16 restrict;
  uint16_t candidate;
  uint16_t candidates;
  Box *box;
  int elm_idx;
  int box_idx;
  int col;
  int row;
  int cell;
  int literal;
  iterator __end2;
  iterator __begin2;
  vector<int,_std::allocator<int>_> *__range2;
  vector<int,_std::allocator<int>_> permutation;
  State state;
  vector<int,_std::allocator<int>_> *in_stack_fffffffffffff8e0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *in_stack_fffffffffffff8e8;
  State *in_stack_fffffffffffff8f0;
  SolverDpllTriadSimd<0> *in_stack_fffffffffffff8f8;
  char local_6f5;
  uint local_6f4;
  uint16_t local_6dc;
  undefined4 in_stack_fffffffffffff928;
  undefined2 in_stack_fffffffffffff92c;
  undefined2 in_stack_fffffffffffff92e;
  undefined4 in_stack_fffffffffffff938;
  undefined4 in_stack_fffffffffffff93c;
  State *in_stack_fffffffffffff988;
  Cells16 *in_stack_fffffffffffffa28;
  int in_stack_fffffffffffffa34;
  State *in_stack_fffffffffffffa38;
  undefined1 local_4c0 [208];
  State *in_stack_fffffffffffffc10;
  char *in_stack_fffffffffffffc18;
  Bitvec16x16 local_2e0;
  ushort local_2a6;
  uint16_t local_292;
  Bitvec16x16 *local_290;
  int local_288;
  int local_284;
  int local_280;
  int local_27c;
  uint local_278;
  uint local_274;
  int *local_270;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_268;
  undefined1 *local_260;
  undefined1 local_258 [24];
  undefined1 local_240 [192];
  Bitvec16x16 aBStack_180 [9];
  long local_50;
  byte local_41;
  byte local_31;
  
  local_41 = in_SIL & 1;
  local_50 = in_RDX;
  State::State(in_stack_fffffffffffff988);
  if ((local_41 & 1) == 0) {
    SolverDpllTriadSimd<0>::InitVanillaByBand
              ((char *)in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0);
  }
  else {
    SolverDpllTriadSimd<0>::InitPencilmarkByBox(in_stack_fffffffffffffc18,in_stack_fffffffffffffc10)
    ;
  }
  Util::Permutation(in_RDI,CONCAT26(in_stack_fffffffffffff92e,
                                    CONCAT24(in_stack_fffffffffffff92c,in_stack_fffffffffffff928)));
  local_260 = local_258;
  local_268._M_current =
       (int *)std::vector<int,_std::allocator<int>_>::begin(in_stack_fffffffffffff8e0);
  local_270 = (int *)std::vector<int,_std::allocator<int>_>::end(in_stack_fffffffffffff8e0);
  do {
    bVar2 = __gnu_cxx::operator!=
                      (in_stack_fffffffffffff8e8,
                       (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> *)
                       in_stack_fffffffffffff8e0);
    if (!bVar2) {
      local_31 = 0;
LAB_0010e929:
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffff8f8);
      return (bool)(local_31 & 1);
    }
    puVar3 = (uint *)__gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                     operator*(&local_268);
    local_274 = *puVar3;
    local_278 = (int)local_274 / 9;
    if ((local_41 & 1) == 0) {
      if (*(char *)(local_50 + (int)local_278) == '.') goto LAB_0010e567;
    }
    else if (*(char *)(local_50 + (int)local_274) != '.') {
LAB_0010e567:
      local_27c = (int)local_278 / 9;
      local_280 = (int)local_278 % 9;
      local_284 = (local_27c / 3) * 3 + local_280 / 3;
      local_288 = local_280 % 3 + local_27c * 4 + (local_27c / 3) * -0xc;
      local_290 = aBStack_180 + local_284;
      local_292 = Bitvec16x16::Extract(local_290,local_288);
      local_2a6 = (ushort)(1 << (sbyte)((ulong)local_274 % 9));
      if (((local_292 & local_2a6) != 0) && (local_292 != local_2a6)) {
        local_2e0.vec[0] = local_290->vec[0];
        local_2e0.vec[1] = local_290->vec[1];
        local_2e0.vec[2] = local_290->vec[2];
        local_2e0.vec[3] = local_290->vec[3];
        local_6dc = local_2a6;
        if ((local_41 & 1) != 0) {
          local_6dc = local_292 ^ local_2a6;
        }
        Bitvec16x16::Insert(&local_2e0,local_288,local_6dc);
        State::State((State *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                     (State *)in_RDI);
        bVar2 = SolverDpllTriadSimd<0>::BoxRestrict<0>
                          (in_stack_fffffffffffffa38,in_stack_fffffffffffffa34,
                           in_stack_fffffffffffffa28);
        if (bVar2) {
          if ((local_41 & 1) == 0) {
            local_6f4 = local_278;
          }
          else {
            local_6f4 = local_274;
          }
          uVar1 = *(undefined1 *)(local_50 + (int)local_6f4);
          if ((local_41 & 1) == 0) {
            local_6f5 = (char)((int)local_274 % 9) + '1';
          }
          else {
            local_6f5 = '.';
          }
          *(char *)(local_50 + (int)local_6f4) = local_6f5;
          in_stack_fffffffffffff8f8 = (SolverDpllTriadSimd<0> *)&stack0xfffffffffffff940;
          State::State((State *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                       (State *)in_RDI);
          sVar4 = SolverDpllTriadSimd<0>::SafeCountSolutionsConsistentWithPartialAssignment
                            (in_stack_fffffffffffff8f8,in_stack_fffffffffffff8f0,
                             (size_t)in_stack_fffffffffffff8e8);
          if (sVar4 == 0) {
            *(undefined1 *)(local_50 + (int)local_6f4) = uVar1;
          }
          else {
            if (sVar4 == 1) {
              local_31 = 1;
              goto LAB_0010e929;
            }
            memcpy(local_240,local_4c0,0x1e0);
          }
        }
      }
    }
    __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
              (&local_268);
  } while( true );
}

Assistant:

bool Constrain(bool pencilmark, char *puzzle) {
        State state;
        if (pencilmark) {
            SolverDpllTriadSimd<0>::InitPencilmarkByBox(puzzle, state);
        } else {
            SolverDpllTriadSimd<0>::InitVanillaByBand(puzzle, state);
        }
        vector<int> permutation = util_.Permutation(729);
        for (int literal : permutation) {
            int cell = literal / 9;

            // skip over clues that were given as part of the partial puzzle.
            if (pencilmark) {
                if (puzzle[literal] == '.') continue;
            } else {
                if (puzzle[cell] != '.') continue;
            }

            int row = cell / 9, col = cell % 9;
            int box_idx = (row / 3) * 3 + (col / 3);
            int elm_idx = (row % 3) * 4 + (col % 3);
            Box &box = state.boxen[box_idx];
            uint16_t candidates = box.cells.Extract(elm_idx);
            uint16_t candidate = 1u << (literal % 9u);

            // quick check that the candidate is not trivially included or excluded before
            // adding as a clue.
            if ((candidates & candidate) && (candidates != candidate)) {
                Cells16 restrict = box.cells;
                restrict.Insert(elm_idx, pencilmark ? candidates ^ candidate : candidate);
                State test_state = state;
                if (SolverDpllTriadSimd<0>::BoxRestrict<0>(test_state, box_idx, restrict)) {
                    int cell_or_literal = pencilmark ? literal : cell;
                    char prior_unconstrained_value = puzzle[cell_or_literal];
                    puzzle[cell_or_literal] = pencilmark ? '.' : (char)('1' + (literal % 9));
                    switch (solver_.SafeCountSolutionsConsistentWithPartialAssignment(
                            test_state, 2)) {
                        case 0:
                            puzzle[cell_or_literal] = prior_unconstrained_value;
                            continue;
                        case 1:
                            return true;
                        default:
                            state = test_state;
                            continue;
                    }
                }
            }
        }
        return false;
    }